

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paths.cc
# Opt level: O2

PathBuilder * __thiscall PathBuilder::Add(PathBuilder *this,string *component)

{
  allocator local_39;
  string local_38 [32];
  
  if (component->_M_string_length != 0) {
    if (*(component->_M_dataplus)._M_p == '/') {
      std::__cxx11::string::string(local_38,"",&local_39);
      std::__cxx11::stringbuf::str((string *)&this->field_0x10);
      std::__cxx11::string::~string(local_38);
    }
    else if (this->trailing_slash_ == false) {
      std::operator<<((ostream *)&this->path_,'/');
    }
    std::operator<<((ostream *)&this->path_,(string *)component);
    this->trailing_slash_ = (component->_M_dataplus)._M_p[component->_M_string_length - 1] == '/';
  }
  return this;
}

Assistant:

PathBuilder& Add(const std::string& component) {
    if (!component.empty()) {
      if (component.front() == '/') {
        path_.str("");
        path_ << component;
      } else {
        if (!trailing_slash_) {
          path_ << '/';
        }
        path_ << component;
      }
      trailing_slash_ = component.back() == '/';
    }
    return *this;
  }